

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_endec_filter_test.cxx
# Opt level: O2

void __thiscall rotating_endec_filter_test::test_method(rotating_endec_filter_test *this)

{
  long *plVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iv_last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iv_last_00;
  pointer puVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bVar3;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  *peVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter;
  auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_> decryptor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> direct;
  symmetric_secrets local_298;
  rotation_key_provider local_268;
  char *local_260;
  rotation_key_provider provider;
  char *local_238;
  char *local_230;
  ulong local_228;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_220;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_218;
  char *local_210;
  char *local_208;
  rotation_key_provider provider_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decrypted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encrypted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  filtering_ostream output;
  
  cryptox::detail::make_random_vector(&input,0x4000);
  uVar7 = 0;
  while (local_220._M_current =
              input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)input.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
    encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    provider._iterations = (size_t)&filter;
    local_228 = uVar7;
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::filtering_stream(&output);
    local_268._iterations = 0;
    cryptox::
    create_rotating_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>
              ((cryptox *)&local_298,&local_268,0x200);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
    ::
    push_impl<cryptox::rotating_evp_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::output>
                *)CONCAT71(output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._1_7_,
                           output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._0_1_),
               (rotating_evp_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
                *)&local_298,-1,-1);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    boost::iostreams::detail::
    chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
    ::push<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
                *)&output,
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &provider,-1,-1,(type *)0x0);
    plVar1 = *(long **)(&output.
                         super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                         .super_stream_type.field_0xd8 +
                       (long)output.
                             super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                             .
                             super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             .
                             super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._vptr_chain_client[-3]);
    (**(code **)(*plVar1 + 0x60))(plVar1,local_220._M_current,local_228);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::output>
    ::reset((chain_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::output>
             *)CONCAT71(output.
                        super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                        .
                        super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .chain_._1_7_,
                        output.
                        super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                        .
                        super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .chain_._0_1_));
    _Var8._M_current = local_220._M_current;
    local_218._M_current = local_220._M_current + local_228;
    boost::iostreams::
    filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::~filtering_stream(&output);
    provider._iterations = 0;
    bVar3.container = &direct;
    while (_Var8._M_current != local_218._M_current) {
      rotation_key_provider::operator()((symmetric_secrets *)&output,&provider);
      iv_last._M_current._1_7_ =
           output.
           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
           .
           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
           .chain_._1_7_;
      iv_last._M_current._0_1_ =
           output.
           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
           .
           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
           .chain_._0_1_;
      cryptox::
      evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
      ::
      evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                  *)&local_298,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )output.
                   super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                   .super_stream_type._8_8_,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )output.
                   super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                   .super_stream_type._16_8_,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )output.
                   super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                   .
                   super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._vptr_chain_client,iv_last);
      uVar7 = (long)local_218._M_current - (long)_Var8._M_current;
      if (0x1ff < uVar7) {
        uVar7 = 0x200;
      }
      bVar3 = cryptox::
              basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
              ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                            *)&local_298,_Var8,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )(_Var8._M_current + uVar7),bVar3);
      cryptox::
      evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
      ::~evp_cipher_context
                ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
                  *)&local_298);
      symmetric_secrets::~symmetric_secrets((symmetric_secrets *)&output);
      _Var8._M_current = _Var8._M_current + uVar7;
    }
    provider._iterations = (size_t)anon_var_dwarf_2aebdd;
    local_268._iterations = (size_t)&boost::unit_test::basic_cstring<char_const>::null;
    local_260 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&provider,0xaf,&local_268);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)&local_298,(equal_coll_impl *)&local_210,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    .chain_._0_1_ = 0;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_chain_client = (_func_int **)&PTR__lazy_ostream_002b7238;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._vptr_basic_ostream = (_func_int **)&boost::unit_test::lazy_ostream::inst;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._8_8_ = (long)"\nCollections size mismatch: " + 0x1c;
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
    ;
    local_230 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_298,&output,&local_238,0xaf,1,0xd,4,"filter.begin()","filter.end()",
               "direct.begin()","direct.end()");
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&encrypted);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    puVar2 = encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    _Var8._M_current =
         encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    provider._iterations = 0;
    boost::iostreams::
    filtering_stream<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::filtering_stream((filtering_stream<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                        *)&output);
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cryptox::
    create_rotating_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>
              ((cryptox *)&local_298,(rotation_key_provider *)&filter,0x200);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::
    push_impl<cryptox::rotating_evp_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)CONCAT71(output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._1_7_,
                           output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._0_1_),
               (rotating_evp_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
                *)&local_298,-1,-1);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = _Var8._M_current;
    local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push_impl<boost::iostreams::basic_array_source<char>>
              ((chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                *)CONCAT71(output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._1_7_,
                           output.
                           super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                           .
                           super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .chain_._0_1_),(basic_array_source<char> *)&local_298,-1,-1);
    if (puVar2 != _Var8._M_current && -1 < (long)puVar2 - (long)_Var8._M_current) {
      boost::iostreams::detail::
      copy_impl<boost::reference_wrapper<boost::iostreams::filtering_stream<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::public_>>,boost::iostreams::detail::output_iterator_adapter<boost::iostreams::output,char,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                ((filtering_stream<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                  *)&output,
                 (output_iterator_adapter<boost::iostreams::output,_char,_std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  )&direct,0x1000);
    }
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
    ::reset((chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
             *)CONCAT71(output.
                        super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                        .
                        super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .chain_._1_7_,
                        output.
                        super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                        .
                        super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .chain_._0_1_));
    boost::iostreams::
    filtering_stream<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
    ::~filtering_stream((filtering_stream<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                         *)&output);
    provider_1._iterations = 0;
    decryptor._M_ptr = (decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_> *)0x0;
    rotation_key_provider::operator()((symmetric_secrets *)&output,&provider_1);
    peVar4 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)operator_new(0x20);
    iv_last_00._M_current._1_7_ =
         output.
         super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
         .
         super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
         .chain_._1_7_;
    iv_last_00._M_current._0_1_ =
         output.
         super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
         .
         super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
         .chain_._0_1_;
    cryptox::
    evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
    ::
    evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (peVar4,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )output.
                        super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                        .super_stream_type._8_8_,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )output.
                 super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                 .super_stream_type._16_8_,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )output.
                 super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
                 .
                 super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._vptr_chain_client,iv_last_00);
    std::auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::reset
              (&decryptor,(element_type *)peVar4);
    bVar3.container = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&provider;
    while (_Var8._M_current != puVar2) {
      sVar5 = cryptox::symmetric_algorithm<&EVP_aes_256_cbc>::block_size();
      local_268._iterations = 0x26c015;
      local_260 = "";
      local_238 = "";
      local_230 = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x8e,&local_238);
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(filter.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             sVar5 <= (ulong)((long)puVar2 - (long)_Var8._M_current));
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_210 = "input_size >= chunk_size";
      local_208 = "";
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_298.iv.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002b72c8;
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
      local_298.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_210;
      local_178 = 
      "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
      ;
      local_170 = "";
      boost::test_tools::tt_detail::report_assertion(&filter,&local_298,&local_178,0x8e,2,0,0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_188 = 
      "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
      ;
      local_180 = "";
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x8f,&local_198);
      sVar6 = cryptox::symmetric_algorithm<&EVP_aes_256_cbc>::block_size();
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(filter.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,sVar5 % sVar6 == 0);
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_210 = "chunk_size % cipher_type::block_size() == 0";
      local_208 = "";
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_298.iv.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002b72c8;
      local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
      local_298.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_210;
      local_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
      ;
      local_1a0 = "";
      boost::test_tools::tt_detail::report_assertion(&filter,&local_298,&local_1a8,0x8f,2,0,0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      last._M_current = _Var8._M_current + sVar5;
      bVar3 = cryptox::
              evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              ::
              update<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                          *)decryptor._M_ptr,_Var8,last,bVar3);
      _Var8._M_current = last._M_current;
      if (((decryptor._M_ptr)->
          super_basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
          ).
          super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
          ._total_output == 0x200) {
        bVar3 = cryptox::
                evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                ::
                finalize<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                            *)decryptor._M_ptr,bVar3);
        rotation_key_provider::operator()(&local_298,&provider_1);
        peVar4 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                  *)operator_new(0x20);
        cryptox::
        evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
        ::
        evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (peVar4,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_298.key.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_298.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        std::auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::reset
                  (&decryptor,(element_type *)peVar4);
        symmetric_secrets::~symmetric_secrets(&local_298);
      }
    }
    cryptox::
    evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
    ::finalize<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                *)decryptor._M_ptr,bVar3);
    symmetric_secrets::~symmetric_secrets((symmetric_secrets *)&output);
    std::auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::~auto_ptr
              (&decryptor);
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
    ;
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    local_268._iterations = (size_t)&boost::unit_test::basic_cstring<char_const>::null;
    local_260 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&filter,0xbd,&local_268);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)&local_298,(equal_coll_impl *)&local_210,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )provider._iterations,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )0x0);
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    .chain_._0_1_ = 0;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_chain_client = (_func_int **)&PTR__lazy_ostream_002b7238;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._vptr_basic_ostream = (_func_int **)&boost::unit_test::lazy_ostream::inst;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._8_8_ = (long)"\nCollections size mismatch: " + 0x1c;
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
    ;
    local_230 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_298,&output,&local_238,0xbd,1,0xd,4,"filter.begin()","filter.end()",
               "direct.begin()","direct.end()");
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&decrypted);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&provider);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
    ;
    filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "";
    direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&filter,0xcc,
               &direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)&local_298,(equal_coll_impl *)&local_268,local_220,local_218,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    .chain_._0_1_ = 0;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .
    super_access_control<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iostreams::public_,_boost::iostreams::detail::pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_pub_<boost::iostreams::detail::chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super_chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_chain_client = (_func_int **)&PTR__lazy_ostream_002b7238;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._vptr_basic_ostream = (_func_int **)&boost::unit_test::lazy_ostream::inst;
    output.
    super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
    .super_stream_type._8_8_ = (long)"\nCollections size mismatch: " + 0x1c;
    provider._iterations = (size_t)anon_var_dwarf_2aebdd;
    boost::test_tools::tt_detail::report_assertion
              (&local_298,&output,&provider,0xcc,1,0xd,4,"first","last","decrypted.begin()",
               "decrypted.end()");
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_298.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&encrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    uVar7 = local_228 + 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rotating_endec_filter_test) {
	std::vector<std::uint8_t> input = cryptox::detail::make_random_vector(16*1024);

	//
	// Slice input and test along...
	//
	const size_t initial = 0;
	size_t increment = 1;
	for (size_t i=initial; i<input.size(); i+=increment)
		roundtrip_test(input.begin(), input.begin() + i);
}